

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::Norm
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  long lVar1;
  TFadExpr<TFadFuncSqrt<TFad<6,_double>_>_> local_a8;
  TFad<6,_double> local_68;
  
  local_68.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0166af08;
  local_68.val_ = 0.0;
  local_68.dx_[0] = 0.0;
  local_68.dx_[5] = 0.0;
  local_68.dx_[1] = 0.0;
  local_68.dx_[2] = 0.0;
  local_68.dx_[3] = 0.0;
  local_68.dx_[4] = 0.0;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x40) {
    local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)
         ((long)((this->fData).super_TPZVec<TFad<6,_double>_>.fStore)->dx_ + lVar1 + -0x10);
    local_a8.fadexpr_.expr_.val_ = (double)local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable
    ;
    TFad<6,double>::operator+=
              ((TFad<6,double> *)&local_68,
               (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_a8);
  }
  local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 1);
  local_a8.fadexpr_.expr_.val_ = (double)local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable;
  TFad<6,double>::operator+=
            ((TFad<6,double> *)&local_68,
             (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_a8);
  local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 2);
  local_a8.fadexpr_.expr_.val_ = (double)local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable;
  TFad<6,double>::operator+=
            ((TFad<6,double> *)&local_68,
             (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_a8);
  local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)((this->fData).super_TPZVec<TFad<6,_double>_>.fStore + 4);
  local_a8.fadexpr_.expr_.val_ = (double)local_a8.fadexpr_.expr_.super_TPZSavable._vptr_TPZSavable;
  TFad<6,double>::operator+=
            ((TFad<6,double> *)&local_68,
             (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_a8);
  sqrt<double,6>(&local_a8,&local_68);
  TFad<6,double>::TFad<TFadFuncSqrt<TFad<6,double>>>
            ((TFad<6,double> *)__return_storage_ptr__,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::Norm() const {
    T norm = T(0.);
    for (unsigned int i = 0; i < 6; i++) {
        norm += fData[i] * fData[i];
    }
    norm += fData[_XY_] * fData[_XY_];
    norm += fData[_XZ_] * fData[_XZ_];
    norm += fData[_YZ_] * fData[_YZ_];
    return sqrt(norm);
}